

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O3

string * __thiscall
cmQtAutoGen::Quoted_abi_cxx11_(string *__return_storage_ptr__,cmQtAutoGen *this,string_view text)

{
  long lVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string res;
  string local_d8;
  undefined8 local_b8;
  char *local_b0;
  char local_a8 [32];
  undefined8 local_88;
  undefined1 *local_80;
  undefined1 local_78 [32];
  basic_string_view<char,_std::char_traits<char>_> local_58;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  undefined8 local_38;
  undefined1 *local_30;
  
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,text._M_len,this + text._M_len,text._M_str);
  lVar1 = 8;
  do {
    cmsys::SystemTools::ReplaceString
              (&local_d8,*(char **)((long)&PTR___cxa_pure_virtual_00952900 + lVar1),
               *(char **)((long)&Quoted[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)
                                 ::replacements + lVar1));
    lVar1 = lVar1 + 0x10;
  } while (lVar1 != 0x98);
  local_b0 = local_a8;
  local_b8 = 1;
  local_a8[0] = '\"';
  local_58._M_len = 1;
  local_48 = local_d8._M_string_length;
  local_40 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)local_d8._M_dataplus._M_p;
  local_80 = local_78;
  local_88 = 1;
  local_78[0] = 0x22;
  local_38 = 1;
  views._M_len = 3;
  views._M_array = &local_58;
  local_58._M_str = local_b0;
  local_30 = local_80;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGen::Quoted(cm::string_view text)
{
  static std::initializer_list<std::pair<const char*, const char*>> const
    replacements = { { "\\", "\\\\" }, { "\"", "\\\"" }, { "\a", "\\a" },
                     { "\b", "\\b" },  { "\f", "\\f" },  { "\n", "\\n" },
                     { "\r", "\\r" },  { "\t", "\\t" },  { "\v", "\\v" } };

  std::string res(text);
  for (auto const& pair : replacements) {
    cmSystemTools::ReplaceString(res, pair.first, pair.second);
  }
  return cmStrCat('"', res, '"');
}